

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_parser.cc
# Opt level: O2

void __thiscall iqxmlrpc::ResponseBuilder::ResponseBuilder(ResponseBuilder *this,Parser *parser)

{
  BuilderBase::BuilderBase(&this->super_BuilderBase,parser,false);
  (this->super_BuilderBase)._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_0019e4a0;
  StateMachine::StateMachine(&this->state_,parser,0);
  (this->ok_).super_type.m_initialized = false;
  (this->fault_str_).super_type.m_initialized = false;
  StateMachine::set_transitions(&this->state_,ResponseBuilder::trans);
  return;
}

Assistant:

ResponseBuilder::ResponseBuilder(Parser& parser):
  BuilderBase(parser),
  state_(parser, NONE)
{
  static const StateMachine::StateTransition trans[] = {
    { NONE, RESPONSE, "methodResponse" },
    { RESPONSE, OK_RESPONSE, "params" },
    { OK_RESPONSE, OK_PARAM, "param" },
    { OK_PARAM, OK_PARAM_VALUE, "value" },
    { RESPONSE, FAULT_RESPONSE, "fault" },
    { FAULT_RESPONSE, FAULT_RESPONSE_VALUE, "value" },
    { 0, 0, 0 }
  };
  state_.set_transitions(trans);
}